

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ReduceSumLayerParams::InternalSwap
          (ReduceSumLayerParams *this,ReduceSumLayerParams *other)

{
  intptr_t iVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  LogMessage *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar1;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    other_00 = google::protobuf::internal::LogMessage::operator<<
                         (&local_50,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other_00);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar5 = (this->axes_).current_size_;
  iVar6 = (this->axes_).total_size_;
  pvVar2 = (this->axes_).arena_or_elements_;
  iVar4 = (other->axes_).total_size_;
  pvVar3 = (other->axes_).arena_or_elements_;
  (this->axes_).current_size_ = (other->axes_).current_size_;
  (this->axes_).total_size_ = iVar4;
  (this->axes_).arena_or_elements_ = pvVar3;
  (other->axes_).current_size_ = iVar5;
  (other->axes_).total_size_ = iVar6;
  (other->axes_).arena_or_elements_ = pvVar2;
  bVar8 = this->keepdims_;
  bVar9 = this->reduceall_;
  bVar7 = other->reduceall_;
  this->keepdims_ = other->keepdims_;
  this->reduceall_ = bVar7;
  other->keepdims_ = bVar8;
  other->reduceall_ = bVar9;
  return;
}

Assistant:

void ReduceSumLayerParams::InternalSwap(ReduceSumLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  axes_.InternalSwap(&other->axes_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(ReduceSumLayerParams, reduceall_)
      + sizeof(ReduceSumLayerParams::reduceall_)
      - PROTOBUF_FIELD_OFFSET(ReduceSumLayerParams, keepdims_)>(
          reinterpret_cast<char*>(&keepdims_),
          reinterpret_cast<char*>(&other->keepdims_));
}